

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O3

int CBB_flush(CBB *cbb)

{
  CBB *cbb_00;
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong len;
  anon_union_32_2_4f6aaa2e_for_u *paVar5;
  byte bVar6;
  ulong __n;
  ulong uVar7;
  cbb_buffer_st *base;
  uint8_t local_39;
  
  paVar5 = &cbb->u;
  base = (cbb_buffer_st *)paVar5;
  if (((cbb->is_child != '\0') && (base = (paVar5->child).base, base == (cbb_buffer_st *)0x0)) ||
     ((base->field_0x18 & 2) != 0)) {
    return 0;
  }
  cbb_00 = cbb->child;
  if (cbb_00 == (CBB *)0x0) {
    return 1;
  }
  if (cbb_00->is_child == '\0') {
    __assert_fail("cbb->child->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0xc5,"int CBB_flush(CBB *)");
  }
  if ((cbb_buffer_st *)(cbb_00->u).base.buf != base) {
    __assert_fail("child->base == base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,199,"int CBB_flush(CBB *)");
  }
  uVar7 = (ulong)(cbb_00->u).child.pending_len_len + (cbb_00->u).base.len;
  iVar2 = CBB_flush(cbb_00);
  if (((iVar2 != 0) && (sVar4 = (cbb_00->u).base.len, sVar4 <= uVar7)) &&
     (__n = base->len - uVar7, uVar7 <= base->len)) {
    bVar6 = (cbb_00->u).child.pending_len_len;
    if ((*(byte *)((long)&cbb_00->u + 0x11) & 1) == 0) {
LAB_0044cc00:
      if (bVar6 != 0) {
        uVar7 = (ulong)bVar6 - 1;
        do {
          base->buf[uVar7 + (cbb_00->u).base.len] = (uint8_t)__n;
          __n = __n >> 8;
          uVar7 = uVar7 - 1;
        } while (uVar7 < (cbb_00->u).child.pending_len_len);
      }
      iVar2 = 0x103;
      if (__n == 0) {
        (cbb_00->u).base.buf = (uint8_t *)0x0;
        iVar2 = 1;
        goto LAB_0044cc5b;
      }
    }
    else {
      if (bVar6 != 1) {
        __assert_fail("child->pending_len_len == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0xd9,"int CBB_flush(CBB *)");
      }
      iVar2 = 0xdc;
      if (__n < 0xffffffff) {
        if (__n < 0x1000000) {
          if (0xffff < __n) {
            local_39 = 0x83;
            uVar3 = 3;
            goto LAB_0044cbab;
          }
          if (0xff < __n) {
            local_39 = 0x82;
            uVar3 = 2;
            goto LAB_0044cbab;
          }
          if (0x7f < __n) {
            local_39 = 0x81;
            uVar3 = 1;
            goto LAB_0044cbab;
          }
          bVar6 = 0;
          local_39 = (uint8_t)__n;
          __n = 0;
        }
        else {
          local_39 = 0x84;
          uVar3 = 4;
LAB_0044cbab:
          len = (ulong)uVar3;
          iVar2 = cbb_buffer_reserve(base,(uint8_t **)0x0,len);
          if (iVar2 == 0) goto LAB_0044cc4b;
          base->len = base->len + len;
          memmove(base->buf + uVar7 + len,base->buf + uVar7,__n);
          sVar4 = (cbb_00->u).base.len;
          bVar6 = (byte)uVar3;
        }
        puVar1 = base->buf;
        (cbb_00->u).base.len = sVar4 + 1;
        puVar1[sVar4] = local_39;
        (cbb_00->u).child.pending_len_len = bVar6;
        goto LAB_0044cc00;
      }
    }
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,iVar2);
  }
LAB_0044cc4b:
  if (cbb->is_child != '\0') {
    paVar5 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar5->base).buf;
  }
  *(undefined1 *)((long)paVar5 + 0x18) = *(undefined1 *)((long)paVar5 + 0x18) | 2;
  iVar2 = 0;
LAB_0044cc5b:
  cbb->child = (CBB *)0x0;
  return iVar2;
}

Assistant:

int CBB_flush(CBB *cbb) {
  // If |base| has hit an error, the buffer is in an undefined state, so
  // fail all following calls. In particular, |cbb->child| may point to invalid
  // memory.
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  if (base == NULL || base->error) {
    return 0;
  }

  if (cbb->child == NULL) {
    // Nothing to flush.
    return 1;
  }

  assert(cbb->child->is_child);
  struct cbb_child_st *child = &cbb->child->u.child;
  assert(child->base == base);
  size_t child_start = child->offset + child->pending_len_len;

  size_t len;
  if (!CBB_flush(cbb->child) || child_start < child->offset ||
      base->len < child_start) {
    goto err;
  }

  len = base->len - child_start;

  if (child->pending_is_asn1) {
    // For ASN.1 we assume that we'll only need a single byte for the length.
    // If that turned out to be incorrect, we have to move the contents along
    // in order to make space.
    uint8_t len_len;
    uint8_t initial_length_byte;

    assert(child->pending_len_len == 1);

    if (len > 0xfffffffe) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      // Too large.
      goto err;
    } else if (len > 0xffffff) {
      len_len = 5;
      initial_length_byte = 0x80 | 4;
    } else if (len > 0xffff) {
      len_len = 4;
      initial_length_byte = 0x80 | 3;
    } else if (len > 0xff) {
      len_len = 3;
      initial_length_byte = 0x80 | 2;
    } else if (len > 0x7f) {
      len_len = 2;
      initial_length_byte = 0x80 | 1;
    } else {
      len_len = 1;
      initial_length_byte = (uint8_t)len;
      len = 0;
    }

    if (len_len != 1) {
      // We need to move the contents along in order to make space.
      size_t extra_bytes = len_len - 1;
      if (!cbb_buffer_add(base, NULL, extra_bytes)) {
        goto err;
      }
      OPENSSL_memmove(base->buf + child_start + extra_bytes,
                      base->buf + child_start, len);
    }
    base->buf[child->offset++] = initial_length_byte;
    child->pending_len_len = len_len - 1;
  }

  for (size_t i = child->pending_len_len - 1; i < child->pending_len_len; i--) {
    base->buf[child->offset + i] = (uint8_t)len;
    len >>= 8;
  }
  if (len != 0) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  child->base = NULL;
  cbb->child = NULL;

  return 1;

err:
  cbb_on_error(cbb);
  return 0;
}